

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StereoMatching.hpp
# Opt level: O2

Mat * ncc(Mat *in1,Mat *in2,string *type,bool add_constant)

{
  long lVar1;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int y;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type __n;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  char in_R8B;
  int i;
  long lVar18;
  int j;
  long lVar19;
  int iVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 local_248 [8];
  Mat depth;
  double local_238;
  long *local_200;
  Mat local_1e8 [8];
  Mat left;
  long local_1d8;
  long *local_1a0;
  Mat local_188 [8];
  Mat right;
  long local_178;
  long *local_140;
  undefined1 local_128 [8];
  vector<double,_std::allocator<double>_> tmp;
  long *local_e0;
  undefined1 auStack_c8 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  max_ncc;
  int local_44;
  allocator_type local_31;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT71(in_register_00000009,add_constant);
  uVar3 = (*(uint **)(in2 + 0x40))[1];
  __n = (size_type)(int)uVar3;
  uVar4 = **(uint **)(in2 + 0x40);
  bgr_to_grey(local_1e8);
  bgr_to_grey(local_188);
  if (in_R8B != '\0') {
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_248,10.0);
    cv::operator+=(local_188,(Scalar *)local_248);
  }
  cv::Mat::Mat((Mat *)local_248,uVar4,uVar3,0);
  auStack_c8 = (undefined1  [8])0x0;
  max_ncc.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  max_ncc.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar21 = 0;
  if (0 < (int)uVar4) {
    uVar21 = (ulong)uVar4;
  }
  uVar9 = uVar21;
  while (iVar11 = (int)uVar9, uVar9 = (ulong)(iVar11 - 1), iVar11 != 0) {
    max_ncc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xc000000000000000;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_128,__n,
               (value_type_conflict2 *)
               &max_ncc.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_31);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)auStack_c8,(value_type *)local_128);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_128);
  }
  iVar11 = uVar3 - 1;
  uVar9 = 0;
  if (0 < (int)uVar3) {
    uVar9 = (ulong)uVar3;
  }
  lVar17 = 1;
  local_44 = iVar11;
  do {
    if (lVar17 == 0x50) {
      cv::Mat::Mat(in1,(Mat *)local_248);
LAB_00104393:
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)auStack_c8);
      cv::Mat::~Mat((Mat *)local_248);
      cv::Mat::~Mat(local_188);
      cv::Mat::~Mat(local_1e8);
      return in1;
    }
    cv::Mat::Mat((Mat *)local_128,uVar4,uVar3,0);
    bVar8 = std::operator==(__lhs,"left");
    if (bVar8) {
      for (uVar10 = 0; uVar10 != uVar21; uVar10 = uVar10 + 1) {
        for (lVar12 = 0; lVar17 != lVar12; lVar12 = lVar12 + 1) {
          *(undefined1 *)
           ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + lVar12 + *local_e0 * uVar10) =
               *(undefined1 *)(lVar12 + *local_140 * uVar10 + local_178);
        }
        lVar13 = 0;
        for (lVar12 = lVar17; lVar12 < (long)__n; lVar12 = lVar12 + 1) {
          *(undefined1 *)
           ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + lVar12 + *local_e0 * uVar10) =
               *(undefined1 *)(lVar13 + *local_140 * uVar10 + local_178);
          lVar13 = lVar13 + 1;
        }
      }
    }
    else {
      bVar8 = std::operator==(__lhs,"right");
      if (!bVar8) {
        cv::Mat::Mat(in1,0,0,0);
        cv::Mat::~Mat((Mat *)local_128);
        goto LAB_00104393;
      }
      for (uVar10 = 0; uVar10 != uVar21; uVar10 = uVar10 + 1) {
        for (lVar12 = 0; lVar13 = (long)local_44, lVar12 < (long)(__n - lVar17); lVar12 = lVar12 + 1
            ) {
          *(undefined1 *)
           ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + lVar12 + *local_e0 * uVar10) =
               *(undefined1 *)(lVar12 + *local_1a0 * uVar10 + local_1d8 + lVar17);
        }
        for (; lVar13 < (long)__n; lVar13 = lVar13 + 1) {
          *(undefined1 *)
           ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + lVar13 + *local_e0 * uVar10) =
               *(undefined1 *)(lVar13 + *local_1a0 * uVar10 + local_1d8);
        }
      }
    }
    uVar10 = 0;
    while( true ) {
      uVar6 = 3;
      if (3 < (int)uVar10) {
        uVar6 = uVar10;
      }
      if (uVar10 == uVar21) break;
      lVar12 = (uVar6 & 0xffffffff) - 3;
      iVar15 = (int)uVar10 + 3;
      if ((int)(uVar4 - 1) <= iVar15) {
        iVar15 = uVar4 - 1;
      }
      lVar13 = (long)iVar15;
      uVar16 = 0;
      while( true ) {
        uVar7 = 3;
        if (3 < (int)uVar16) {
          uVar7 = uVar16;
        }
        if (uVar16 == uVar9) break;
        lVar1 = (uVar7 & 0xffffffff) - 3;
        iVar20 = (int)uVar16 + 3;
        if (iVar11 <= iVar20) {
          iVar20 = iVar11;
        }
        dVar22 = (double)(((iVar20 - (int)uVar7) + 3) * ((iVar15 - (int)uVar6) + 3));
        bVar8 = std::operator==(__lhs,"left");
        lVar14 = (long)iVar20;
        if (bVar8) {
          dVar24 = 0.0;
          dVar25 = 0.0;
          for (lVar18 = lVar12; lVar19 = lVar1, lVar18 <= lVar13; lVar18 = lVar18 + 1) {
            for (; lVar19 <= lVar14; lVar19 = lVar19 + 1) {
              dVar24 = dVar24 + (double)*(byte *)(lVar19 + *local_1a0 * lVar18 + local_1d8);
              dVar25 = dVar25 + (double)*(byte *)((long)tmp.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                 lVar19 + *local_e0 * lVar18);
            }
          }
          dVar23 = 0.0;
          dVar29 = 0.0;
          dVar28 = 0.0;
          for (lVar18 = lVar12; lVar19 = lVar1, lVar18 <= lVar13; lVar18 = lVar18 + 1) {
            for (; lVar19 <= lVar14; lVar19 = lVar19 + 1) {
              dVar26 = (double)*(byte *)(lVar19 + *local_1a0 * lVar18 + local_1d8) - dVar24 / dVar22
              ;
              dVar23 = dVar23 + dVar26 * dVar26;
              dVar27 = (double)*(byte *)((long)tmp.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_finish +
                                        lVar19 + *local_e0 * lVar18) - dVar25 / dVar22;
              dVar29 = dVar29 + dVar27 * dVar27;
              dVar28 = dVar28 + dVar26 * dVar27;
            }
          }
        }
        else {
          dVar24 = 0.0;
          dVar25 = 0.0;
          for (lVar18 = lVar12; lVar19 = lVar1, lVar18 <= lVar13; lVar18 = lVar18 + 1) {
            for (; lVar19 <= lVar14; lVar19 = lVar19 + 1) {
              dVar24 = dVar24 + (double)*(byte *)((long)tmp.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                 lVar19 + *local_e0 * lVar18);
              dVar25 = dVar25 + (double)*(byte *)(lVar19 + *local_140 * lVar18 + local_178);
            }
          }
          dVar23 = 0.0;
          dVar29 = 0.0;
          dVar28 = 0.0;
          for (lVar18 = lVar12; lVar19 = lVar1, lVar18 <= lVar13; lVar18 = lVar18 + 1) {
            for (; lVar19 <= lVar14; lVar19 = lVar19 + 1) {
              dVar26 = (double)*(byte *)((long)tmp.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_finish +
                                        lVar19 + *local_e0 * lVar18) - dVar24 / dVar22;
              dVar23 = dVar23 + dVar26 * dVar26;
              dVar27 = (double)*(byte *)(lVar19 + *local_140 * lVar18 + local_178) - dVar25 / dVar22
              ;
              dVar29 = dVar29 + dVar27 * dVar27;
              dVar28 = dVar28 + dVar26 * dVar27;
            }
          }
        }
        dVar23 = dVar23 / dVar22;
        if (dVar23 < 0.0) {
          dVar23 = sqrt(dVar23);
        }
        else {
          dVar23 = SQRT(dVar23);
        }
        dVar29 = dVar29 / dVar22;
        if (dVar29 < 0.0) {
          dVar29 = sqrt(dVar29);
        }
        else {
          dVar29 = SQRT(dVar29);
        }
        dVar22 = ((dVar28 / dVar22) / (dVar23 * dVar29)) / dVar22;
        pdVar5 = (((pointer)((long)auStack_c8 + uVar10 * 0x18))->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = pdVar5 + uVar16;
        if (*pdVar2 <= dVar22 && dVar22 != *pdVar2) {
          pdVar5[uVar16] = dVar22;
          *(char *)(uVar16 + *local_200 * uVar10 + (long)local_238) = (char)lVar17 * '\x03';
        }
        uVar16 = uVar16 + 1;
      }
      uVar10 = uVar10 + 1;
    }
    cv::Mat::~Mat((Mat *)local_128);
    lVar17 = lVar17 + 1;
    local_44 = local_44 + -1;
  } while( true );
}

Assistant:

Mat
ncc(Mat in1, Mat in2, string type, bool add_constant=false)
{
    int width = in1.size().width;
    int height = in1.size().height;
    int max_offset = 79;
    int kernel_size = 3; // window size

    Mat left = bgr_to_grey(in1);
    Mat right = bgr_to_grey(in2);

    if (add_constant)
    {
        right += 10;
    }

    Mat depth(height, width, 0);
    vector< vector<double> > max_ncc; // store max NCC value

    for (int i = 0; i < height; ++i)
    {
        vector<double> tmp(width, -2);
        max_ncc.push_back(tmp);
    }

    for (int offset = 1; offset <= max_offset; offset++)
    {
        Mat tmp(height, width, 0);
        // shift image depend on type to save calculation time
        if (type == "left")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < offset; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x);
                }

                for (int x = offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x - offset);
                }
            }
        }
        else if (type == "right")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < width - offset; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x + offset);
                }

                for (int x = width - offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x);
                }
            }
        }
        else
        {
            Mat tmp(0, 0, 0);
            return tmp;
        }

        // calculate each pixel's NCC value
        for (int y = 0; y < height; y++)
        {
            for (int x = 0; x < width; x++)
            {
                int start_x = max(0, x - kernel_size);
                int start_y = max(0, y - kernel_size);
                int end_x = min(width - 1, x + kernel_size);
                int end_y = min(height - 1, y + kernel_size);
                double n = (end_y - start_y) * (end_x - start_x);
                double res_ncc = 0;

                if (type == "left")
                {
                    double left_mean = 0, right_mean = 0;
                    double left_std = 0, right_std = 0;
                    double numerator = 0;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_mean += left.at<uchar>(i, j);
                            right_mean += tmp.at<uchar>(i, j);
                        }
                    }

                    left_mean /= n;
                    right_mean /= n;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_std += pow(left.at<uchar>(i, j) - left_mean, 2);
                            right_std += pow(tmp.at<uchar>(i, j) - right_mean, 2);
                            numerator += (left.at<uchar>(i, j) - left_mean) * (tmp.at<uchar>(i, j) - right_mean);
                        }
                    }

                    numerator /= n;
                    left_std /= n;
                    right_std /= n;
                    res_ncc = numerator / (sqrt(left_std) * sqrt(right_std)) / n;
                }
                else
                {
                    double left_mean = 0, right_mean = 0;
                    double left_std = 0, right_std = 0;
                    double numerator = 0;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_mean += tmp.at<uchar>(i, j);
                            right_mean += right.at<uchar>(i, j);
                        }
                    }

                    left_mean /= n;
                    right_mean /= n;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_std += pow(tmp.at<uchar>(i, j) - left_mean, 2);
                            right_std += pow(right.at<uchar>(i, j) - right_mean, 2);
                            numerator += (tmp.at<uchar>(i, j) - left_mean) * (right.at<uchar>(i, j) - right_mean);
                        }
                    }

                    numerator /= n;
                    left_std /= n;
                    right_std /= n;
                    res_ncc = numerator / (sqrt(left_std) * sqrt(right_std)) / n;
                }

                // greater NCC value found
                if (res_ncc > max_ncc[y][x])
                {
                    max_ncc[y][x] = res_ncc;
                    // for better visualization
                    depth.at<uchar>(y, x) = (uchar)(offset * 3);
                }
            }
        }
    }

    return depth;
}